

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t is_symlink(char *file,wchar_t line,char *pathname,char *contents)

{
  int iVar1;
  ssize_t sVar2;
  char *in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t r;
  ssize_t linklen;
  stat st;
  char buff [300];
  stat local_1e8;
  char local_158 [40];
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  iVar1 = lstat(in_RDX,&local_1e8);
  if (iVar1 == 0) {
    if ((local_1e8.st_mode & 0xf000) == 0xa000) {
      if (in_RCX == (char *)0x0) {
        local_4 = L'\x01';
      }
      else {
        sVar2 = readlink(in_RDX,local_158,300);
        if (sVar2 < 0) {
          failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Can\'t read symlink %s",in_RDX);
          failure_finish((void *)0x107965);
          local_4 = L'\0';
        }
        else {
          local_158[sVar2] = '\0';
          iVar1 = strcmp(local_158,in_RCX);
          if (iVar1 == 0) {
            local_4 = L'\x01';
          }
          else {
            local_4 = L'\0';
          }
        }
      }
    }
    else {
      local_4 = L'\0';
    }
  }
  else {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Symlink should exist: %s",in_RDX);
    failure_finish((void *)0x1078c5);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
is_symlink(const char *file, int line,
    const char *pathname, const char *contents)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)pathname; /* UNUSED */
	(void)contents; /* UNUSED */
	assertion_count(file, line);
	/* Windows sort-of has real symlinks, but they're only usable
	 * by privileged users and are crippled even then, so there's
	 * really not much point in bothering with this. */
	return (0);
#else
	char buff[300];
	struct stat st;
	ssize_t linklen;
	int r;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line,
		    "Symlink should exist: %s", pathname);
		failure_finish(NULL);
		return (0);
	}
	if (!S_ISLNK(st.st_mode))
		return (0);
	if (contents == NULL)
		return (1);
	linklen = readlink(pathname, buff, sizeof(buff));
	if (linklen < 0) {
		failure_start(file, line, "Can't read symlink %s", pathname);
		failure_finish(NULL);
		return (0);
	}
	buff[linklen] = '\0';
	if (strcmp(buff, contents) != 0)
		return (0);
	return (1);
#endif
}